

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O2

int unicode_decomp_entry(uint32_t *res,uint32_t c,int idx,uint32_t code,uint32_t len,uint32_t type)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ushort *puVar10;
  uint uVar11;
  uint uVar12;
  ushort *puVar13;
  
  uVar8 = (ulong)unicode_decomp_table2[idx];
  if (type == 0) {
    *res = (uint)unicode_decomp_table2[idx];
    return 1;
  }
  uVar6 = 0;
  if (0x21 < type - 1) {
    return 0;
  }
  puVar10 = (ushort *)(unicode_decomp_data + uVar8);
  switch(type) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    uVar8 = 0;
    do {
      if (type == uVar8) {
        return type;
      }
      uVar11 = (uint)*(ushort *)((long)puVar10 + uVar8 * 2 + (ulong)((c - code) * type * 2));
      res[uVar8] = uVar11;
      uVar8 = uVar8 + 1;
    } while (uVar11 != 0);
    break;
  case 8:
  case 9:
    uVar12 = type - 7;
    uVar4 = (c - code) * uVar12;
    uVar11 = uVar4 * 2;
    uVar8 = 0;
    while( true ) {
      if (uVar12 == uVar8) {
        return uVar12;
      }
      uVar7 = (*(byte *)((long)puVar10 +
                        (ulong)(((uint)(uVar4 + uVar8 >> 2) & 0x3fffffff) + len * uVar12 * 2)) >>
               ((byte)uVar11 & 6) & 3) << 0x10 | (uint)*(ushort *)((long)puVar10 + (ulong)uVar11);
      if (uVar7 == 0) break;
      res[uVar8] = uVar7;
      uVar8 = uVar8 + 1;
      uVar11 = uVar11 + 2;
    }
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    uVar11 = type - 9;
    uVar8 = 0;
    do {
      if (uVar11 == uVar8) {
        return uVar11;
      }
      uVar5 = unicode_get_short_code((uint)*(byte *)((long)puVar10 + uVar8 + (c - code) * uVar11));
      res[uVar8] = uVar5;
      uVar8 = uVar8 + 1;
    } while (uVar5 != 0);
    break;
  case 0xf:
    uVar11 = 1;
    goto LAB_0016296d;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    uVar11 = (type - 0x10 >> 1) + 2;
    uVar6 = (ulong)(((type & 1) + 1) - (uint)(type - 0x10 < 2));
LAB_0016296d:
    for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      iVar9 = 0;
      if (uVar6 == uVar8) {
        iVar9 = c - code;
      }
      res[uVar8] = iVar9 + (uint)puVar10[uVar8];
    }
    return uVar11;
  default:
    uVar11 = type - 0x15;
    goto LAB_001628de;
  case 0x1e:
    uVar11 = 0x12;
LAB_001628de:
    uVar3 = *puVar10;
    for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      bVar2 = *(byte *)((long)puVar10 + uVar8 + ((c - code) * uVar11 + 2));
      uVar5 = (uint)bVar2 + (uint)uVar3;
      if (bVar2 == 0xff) {
        uVar5 = 0x20;
      }
      res[uVar8] = uVar5;
    }
    return uVar11;
  case 0x1f:
    uVar6 = (ulong)((c - code) * 3);
    uVar11 = (uint)*(ushort *)((long)puVar10 + uVar6);
    *res = uVar11;
    if (uVar11 == 0) {
      return 0;
    }
    bVar2 = unicode_decomp_data[uVar6 + uVar8 + 2];
    goto LAB_00162adc;
  case 0x20:
    *res = (uint)*puVar10;
    res[2] = (uint)*(ushort *)(unicode_decomp_data + uVar8 + 2);
    res[1] = (uint)*(ushort *)((long)puVar10 + (ulong)((c - code) * 2 + 4));
    return 3;
  case 0x21:
  case 0x22:
    uVar11 = c - code;
    if (type == 0x21) {
      pbVar1 = (byte *)((long)puVar10 + (ulong)(uVar11 & 0xfffffffe));
      puVar13 = (ushort *)(pbVar1 + 1);
      uVar4 = unicode_get_short_code((uint)*pbVar1);
    }
    else {
      puVar10 = (ushort *)((long)puVar10 + (ulong)((uVar11 >> 1) * 3));
      puVar13 = puVar10 + 1;
      uVar4 = (uint)*puVar10;
    }
    if ((uVar11 & 1) != 0) {
      iVar9 = 1;
      if (uVar4 - 0x410 < 0x20) {
        iVar9 = 0x20;
      }
      if (uVar4 < 0x100) {
        iVar9 = 0x20;
      }
      uVar4 = iVar9 + uVar4;
    }
    *res = uVar4;
    bVar2 = (byte)*puVar13;
LAB_00162adc:
    uVar5 = unicode_get_short_code((uint)bVar2);
    res[1] = uVar5;
    return 2;
  }
  return 0;
}

Assistant:

static int unicode_decomp_entry(uint32_t *res, uint32_t c,
                                int idx, uint32_t code, uint32_t len,
                                uint32_t type)
{
    uint32_t c1;
    int l, i, p;
    const uint8_t *d;

    if (type == DECOMP_TYPE_C1) {
        res[0] = unicode_decomp_table2[idx];
        return 1;
    } else {
        d = unicode_decomp_data + unicode_decomp_table2[idx];
        switch(type) {
        case DECOMP_TYPE_L1:
        case DECOMP_TYPE_L2:
        case DECOMP_TYPE_L3:
        case DECOMP_TYPE_L4:
        case DECOMP_TYPE_L5:
        case DECOMP_TYPE_L6:
        case DECOMP_TYPE_L7:
            l = type - DECOMP_TYPE_L1 + 1;
            d += (c - code) * l * 2;
            for(i = 0; i < l; i++) {
                if ((res[i] = unicode_get16(d + 2 * i)) == 0)
                    return 0;
            }
            return l;
        case DECOMP_TYPE_LL1:
        case DECOMP_TYPE_LL2:
            {
                uint32_t k, p;
                l = type - DECOMP_TYPE_LL1 + 1;
                k = (c - code) * l;
                p = len * l * 2;
                for(i = 0; i < l; i++) {
                    c1 = unicode_get16(d + 2 * k) |
                        (((d[p + (k / 4)] >> ((k % 4) * 2)) & 3) << 16);
                    if (!c1)
                        return 0;
                    res[i] = c1;
                    k++;
                }
            }
            return l;
        case DECOMP_TYPE_S1:
        case DECOMP_TYPE_S2:
        case DECOMP_TYPE_S3:
        case DECOMP_TYPE_S4:
        case DECOMP_TYPE_S5:
            l = type - DECOMP_TYPE_S1 + 1;
            d += (c - code) * l;
            for(i = 0; i < l; i++) {
                if ((res[i] = unicode_get_short_code(d[i])) == 0)
                    return 0;
            }
            return l;
        case DECOMP_TYPE_I1:
            l = 1;
            p = 0;
            goto decomp_type_i;
        case DECOMP_TYPE_I2_0:
        case DECOMP_TYPE_I2_1:
        case DECOMP_TYPE_I3_1:
        case DECOMP_TYPE_I3_2:
        case DECOMP_TYPE_I4_1:
        case DECOMP_TYPE_I4_2:
            l = 2 + ((type - DECOMP_TYPE_I2_0) >> 1);
            p = ((type - DECOMP_TYPE_I2_0) & 1) + (l > 2);
        decomp_type_i:
            for(i = 0; i < l; i++) {
                c1 = unicode_get16(d + 2 * i);
                if (i == p)
                    c1 += c - code;
                res[i] = c1;
            }
            return l;
        case DECOMP_TYPE_B18:
            l = 18;
            goto decomp_type_b;
        case DECOMP_TYPE_B1:
        case DECOMP_TYPE_B2:
        case DECOMP_TYPE_B3:
        case DECOMP_TYPE_B4:
        case DECOMP_TYPE_B5:
        case DECOMP_TYPE_B6:
        case DECOMP_TYPE_B7:
        case DECOMP_TYPE_B8:
            l = type - DECOMP_TYPE_B1 + 1;
        decomp_type_b:
            {
                uint32_t c_min;
                c_min = unicode_get16(d);
                d += 2 + (c - code) * l;
                for(i = 0; i < l; i++) {
                    c1 = d[i];
                    if (c1 == 0xff)
                        c1 = 0x20;
                    else
                        c1 += c_min;
                    res[i] = c1;
                }
            }
            return l;
        case DECOMP_TYPE_LS2:
            d += (c - code) * 3;
            if (!(res[0] = unicode_get16(d)))
                return 0;
            res[1] = unicode_get_short_code(d[2]);
            return 2;
        case DECOMP_TYPE_PAT3:
            res[0] = unicode_get16(d);
            res[2] = unicode_get16(d + 2);
            d += 4 + (c - code) * 2;
            res[1] = unicode_get16(d);
            return 3;
        case DECOMP_TYPE_S2_UL:
        case DECOMP_TYPE_LS2_UL:
            c1 = c - code;
            if (type == DECOMP_TYPE_S2_UL) {
                d += c1 & ~1;
                c = unicode_get_short_code(*d);
                d++;
            } else {
                d += (c1 >> 1) * 3;
                c = unicode_get16(d);
                d += 2;
            }
            if (c1 & 1)
                c = unicode_get_lower_simple(c);
            res[0] = c;
            res[1] = unicode_get_short_code(*d);
            return 2;
        }
    }
    return 0;
}